

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O1

void __thiscall QSlider::initStyleOption(QSlider *this,QStyleOptionSlider *option)

{
  State *pSVar1;
  Orientation OVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  
  if (option != (QStyleOptionSlider *)0x0) {
    lVar3 = *(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
    QStyleOption::initFrom((QStyleOption *)option,(QWidget *)this);
    (option->super_QStyleOptionComplex).subControls =
         (QFlagsStorageHelper<QStyle::SubControl,_4>)0x0;
    (option->super_QStyleOptionComplex).activeSubControls =
         (QFlagsStorageHelper<QStyle::SubControl,_4>)0x0;
    OVar2 = *(Orientation *)(lVar3 + 0x280);
    option->orientation = OVar2;
    uVar4 = *(undefined8 *)(lVar3 + 0x254);
    option->minimum = (int)uVar4;
    option->maximum = (int)((ulong)uVar4 >> 0x20);
    uVar4 = *(undefined8 *)(lVar3 + 0x294);
    option->tickPosition = (int)((ulong)uVar4 >> 0x20);
    option->tickInterval = (int)uVar4;
    if (OVar2 == Horizontal) {
      bVar5 = (bool)((*(byte *)(lVar3 + 0x27c) & 8) >> 3 ^
                    (option->super_QStyleOptionComplex).super_QStyleOption.direction == RightToLeft)
      ;
    }
    else {
      bVar5 = (*(byte *)(lVar3 + 0x27c) & 8) == 0;
    }
    option->upsideDown = bVar5;
    (option->super_QStyleOptionComplex).super_QStyleOption.direction = LeftToRight;
    uVar4 = *(undefined8 *)(lVar3 + 0x260);
    option->sliderPosition = (int)((ulong)uVar4 >> 0x20);
    option->sliderValue = (int)uVar4;
    option->singleStep = *(int *)(lVar3 + 0x26c);
    option->pageStep = *(int *)(lVar3 + 0x25c);
    if (OVar2 == Horizontal) {
      pSVar1 = &(option->super_QStyleOptionComplex).super_QStyleOption.state;
      *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                super_QFlagsStorage<QStyle::StateFlag>.i =
           (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                 super_QFlagsStorage<QStyle::StateFlag>.i | 0x80;
    }
    if (*(Int *)(lVar3 + 0x290) == 0) {
      (option->super_QStyleOptionComplex).activeSubControls.
      super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
           *(Int *)(lVar3 + 0x2a0);
    }
    else {
      (option->super_QStyleOptionComplex).activeSubControls.
      super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
           *(Int *)(lVar3 + 0x290);
      pSVar1 = &(option->super_QStyleOptionComplex).super_QStyleOption.state;
      *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                super_QFlagsStorage<QStyle::StateFlag>.i =
           (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                 super_QFlagsStorage<QStyle::StateFlag>.i | 4;
    }
  }
  return;
}

Assistant:

void QSlider::initStyleOption(QStyleOptionSlider *option) const
{
    if (!option)
        return;

    Q_D(const QSlider);
    option->initFrom(this);
    option->subControls = QStyle::SC_None;
    option->activeSubControls = QStyle::SC_None;
    option->orientation = d->orientation;
    option->maximum = d->maximum;
    option->minimum = d->minimum;
    option->tickPosition = (QSlider::TickPosition)d->tickPosition;
    option->tickInterval = d->tickInterval;
    option->upsideDown = (d->orientation == Qt::Horizontal) ?
                     (d->invertedAppearance != (option->direction == Qt::RightToLeft))
                     : (!d->invertedAppearance);
    option->direction = Qt::LeftToRight; // we use the upsideDown option instead
    option->sliderPosition = d->position;
    option->sliderValue = d->value;
    option->singleStep = d->singleStep;
    option->pageStep = d->pageStep;
    if (d->orientation == Qt::Horizontal)
        option->state |= QStyle::State_Horizontal;

    if (d->pressedControl) {
        option->activeSubControls = d->pressedControl;
        option->state |= QStyle::State_Sunken;
    } else {
        option->activeSubControls = d->hoverControl;
    }
}